

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::Graph(Graph *this,int nv)

{
  Graph *local_78;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_30;
  int nv_local;
  Graph *this_local;
  
  this->num_of_vert = 0;
  memcpy(this->adj_matrix,&DAT_00108004,10000);
  this->adjoint_status = true;
  this->line_status = true;
  this->multigraph_status = false;
  local_30 = this->adj_list;
  do {
    std::vector<int,_std::allocator<int>_>::vector(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != this->original_list);
  local_58 = this->original_list;
  do {
    std::vector<int,_std::allocator<int>_>::vector(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != this->pred_list);
  local_78 = (Graph *)this->pred_list;
  do {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_78);
    local_78 = (Graph *)(local_78->adj_matrix[0] + 5);
  } while (local_78 != this + 1);
  this->num_of_vert = nv;
  createMatrix(this);
  createList(this);
  createPredList(this);
  return;
}

Assistant:

Graph::Graph(int nv){
   this->num_of_vert = nv;
   this->createMatrix();
   this->createList();
   this->createPredList();
}